

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_deep_copy_non_container
          (t_java_generator *this,ostream *out,string *source_name,string *dest_name,t_type *type)

{
  uint uVar1;
  ostream *poVar2;
  string local_50;
  t_type *local_30;
  t_type *type_local;
  string *dest_name_local;
  string *source_name_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  local_30 = type;
  type_local = (t_type *)dest_name;
  dest_name_local = source_name;
  source_name_local = (string *)out;
  out_local = (ostream *)this;
  local_30 = t_generator::get_true_type(type);
  uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[5])();
  if ((((uVar1 & 1) == 0) &&
      (uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[10])(), (uVar1 & 1) == 0)) &&
     (uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[9])(), (uVar1 & 1) == 0)) {
    poVar2 = std::operator<<((ostream *)source_name_local,"new ");
    type_name_abi_cxx11_(&local_50,this,local_30,true,true,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    std::operator<<(poVar2,")");
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[7])();
    if ((uVar1 & 1) == 0) {
      std::operator<<((ostream *)source_name_local,(string *)source_name);
    }
    else {
      poVar2 = std::operator<<((ostream *)source_name_local,
                               "org.apache.thrift.TBaseHelper.copyBinary(");
      poVar2 = std::operator<<(poVar2,(string *)source_name);
      std::operator<<(poVar2,")");
    }
  }
  return;
}

Assistant:

void t_java_generator::generate_deep_copy_non_container(ostream& out,
                                                        std::string source_name,
                                                        std::string dest_name,
                                                        t_type* type) {
  (void)dest_name;
  type = get_true_type(type);
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    if (type->is_binary()) {
      out << "org.apache.thrift.TBaseHelper.copyBinary(" << source_name << ")";
    } else {
      // everything else can be copied directly
      out << source_name;
    }
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}